

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# instdb.cpp
# Opt level: O2

size_t asmjit::v1_14::InstNameUtils::decodeToBuffer
                 (char *nameOut,uint32_t nameValue,char *stringTable)

{
  ulong uVar1;
  size_t sVar2;
  uint uVar3;
  char cVar4;
  ulong uVar5;
  size_t sStack_8;
  
  if ((int)nameValue < 0) {
    sStack_8 = 6;
    for (sVar2 = 0; sVar2 != 6; sVar2 = sVar2 + 1) {
      uVar3 = nameValue & 0x1f;
      if (uVar3 == 0) {
        return sVar2;
      }
      cVar4 = (char)uVar3 + '`';
      if (0x1a < uVar3) {
        cVar4 = (char)uVar3 + '\x15';
      }
      nameOut[sVar2] = cVar4;
      nameValue = nameValue >> 5;
    }
  }
  else {
    uVar1 = (ulong)(nameValue >> 0xc & 0xf);
    for (uVar5 = 0; uVar1 != uVar5; uVar5 = uVar5 + 1) {
      nameOut[uVar5] = stringTable[uVar5 + (nameValue & 0xfff)];
    }
    for (uVar5 = 0; nameValue >> 0x1c != uVar5; uVar5 = uVar5 + 1) {
      nameOut[uVar5 + uVar1] = stringTable[uVar5 + (nameValue >> 0x10 & 0xfff)];
    }
    sStack_8 = uVar1 + (nameValue >> 0x1c);
  }
  return sStack_8;
}

Assistant:

static ASMJIT_FORCE_INLINE size_t decodeToBuffer(char nameOut[kBufferSize], uint32_t nameValue, const char* stringTable) noexcept {
  size_t i;

  if (nameValue & 0x80000000u) {
    // Small string of 5-bit characters.
    for (i = 0; i < 6; i++, nameValue >>= 5) {
      uint32_t c = nameValue & 0x1F;
      if (c == 0)
        break;
      nameOut[i] = decode5BitChar(c);
    }
    return i;
  }
  else {
    size_t prefixBase = nameValue & 0xFFFu;
    size_t prefixSize = (nameValue >> 12) & 0xFu;

    size_t suffixBase = (nameValue >> 16) & 0xFFFu;
    size_t suffixSize = (nameValue >> 28) & 0x7u;

    for (i = 0; i < prefixSize; i++)
      nameOut[i] = stringTable[prefixBase + i];

    char* suffixOut = nameOut + prefixSize;
    for (i = 0; i < suffixSize; i++)
      suffixOut[i] = stringTable[suffixBase + i];

    return prefixSize + suffixSize;
  }
}